

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.c
# Opt level: O1

void reduce_relational_op(List *list)

{
  TokenType TVar1;
  List *ls;
  long lVar2;
  long lVar3;
  int iVar4;
  BOOL BVar5;
  ListStruct *pLVar6;
  char *pcVar7;
  bool bVar8;
  
  ls = list->car;
  iVar4 = list_length(ls);
  if (iVar4 != 3) {
    parse_error(ls,"Incorrect number of arguments to %s operator.\n",(ls->token).u.string);
    return;
  }
  pLVar6 = ls->cdr;
  TVar1 = (pLVar6->token).type;
  if ((TVar1 - TOK_IDENTIFIER < 3) && (TVar1 == (pLVar6->cdr->token).type)) {
    BVar5 = tokens_equal(&pLVar6->token,&pLVar6->cdr->token);
    TVar1 = (ls->token).type;
    if (TVar1 != TOK_EQUAL) {
      if (TVar1 == TOK_NOT_EQUAL) {
        BVar5 = (BOOL)(BVar5 == FALSE);
      }
      else {
        pLVar6 = ls->cdr;
        if (((pLVar6->token).type == TOK_NUMBER) && ((pLVar6->cdr->token).type == TOK_NUMBER)) {
          if (TVar1 - TOK_GREATER_THAN < 4) {
            lVar2 = (pLVar6->token).u.n;
            lVar3 = (pLVar6->cdr->token).u.n;
            switch(TVar1) {
            case TOK_GREATER_THAN:
              bVar8 = lVar3 < lVar2;
              break;
            case TOK_LESS_THAN:
              bVar8 = lVar2 < lVar3;
              break;
            case TOK_GREATER_OR_EQUAL:
              bVar8 = lVar3 <= lVar2;
              break;
            case TOK_LESS_OR_EQUAL:
              bVar8 = lVar2 <= lVar3;
            }
          }
          else {
            bVar8 = false;
            fatal_parse_error(ls,
                              "reduce.c internal error: non-relational op passed to reduce_relational_op().\n"
                             );
          }
          pLVar6 = (ListStruct *)(ulong)bVar8;
          bVar8 = true;
        }
        else {
          bVar8 = false;
        }
        BVar5 = (BOOL)pLVar6;
        if (!bVar8) {
          return;
        }
      }
    }
    list->car = (ListStruct *)0x0;
    (list->token).type = (uint)(BVar5 != FALSE);
    pcVar7 = "false";
    if (BVar5 != FALSE) {
      pcVar7 = "true";
    }
    (list->token).u.string = pcVar7;
  }
  return;
}

Assistant:

static void
reduce_relational_op (List *list)
{
  BOOL equal, val;
  List *ls = list->car;

  /* Make sure there are the right # of args. */
  if (list_length (ls) != 3)
    {
      parse_error (ls, "Incorrect number of arguments to %s operator.\n",
		   ls->token.u.string);
      return;
    }
  
  /* Make sure we are comparing two things of equal and appropriate types. */
  if (ls->cdr->token.type != (CDDR (ls))->token.type
      || (ls->cdr->token.type != TOK_NUMBER
	  && ls->cdr->token.type != TOK_IDENTIFIER
	  && ls->cdr->token.type != TOK_QUOTED_STRING))
    return;

  /* Are the two tokens equal? */
  equal = tokens_equal (&ls->cdr->token, &CDDR(ls)->token);

  /* See if we need to do a numeric or an arbitrary comparison. */
  if (ls->token.type == TOK_EQUAL)
    val = equal;
  else if (ls->token.type == TOK_NOT_EQUAL)
    val = !equal;
  else  /* It's a numerical comparison. */
    {
      long n1, n2;

      if (ls->cdr->token.type != TOK_NUMBER
	  || CDDR(ls)->token.type != TOK_NUMBER)
	{
	  return;
	}

      /* Fetch the two numbers to be compared. */
      n1 = ls->cdr->token.u.n;
      n2 = CDDR(ls)->token.u.n;

      switch (ls->token.type) {
      case TOK_GREATER_THAN:
	val = (n1 > n2);
	break;
      case TOK_LESS_THAN:
	val = (n1 < n2);
	break;
      case TOK_GREATER_OR_EQUAL:
	val = (n1 >= n2);
	break;
      case TOK_LESS_OR_EQUAL:
	val = (n1 <= n2);
	break;
      default:
	val = FALSE;
	fatal_parse_error (ls, "reduce.c internal error: non-relational op "
			   "passed to reduce_relational_op().\n");
	break;
      }
    }

  set_list_to_boolean (list, val ? TOK_TRUE : TOK_FALSE);
}